

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void __thiscall hypermind::ASTIfStmt::dump(ASTIfStmt *this,Ostream *os)

{
  bool bVar1;
  element_type *peVar2;
  Ostream *os_local;
  ASTIfStmt *this_local;
  
  std::operator<<(os,"if  condition : ");
  peVar2 = std::__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->condition);
  (**peVar2->_vptr_ASTNode)(peVar2,os);
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->thenBlock);
  (**peVar2->_vptr_ASTNode)(peVar2,os);
  bVar1 = std::operator!=(&this->elseBlock,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<(os," else ");
    peVar2 = std::__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->elseBlock);
    (**peVar2->_vptr_ASTNode)(peVar2,os);
  }
  return;
}

Assistant:

AST_DUMP(ASTIfStmt) {
        os << _HM_C("if  condition : ");
        condition->dump(os);
        os << std::endl;
        thenBlock->dump(os);
        if (elseBlock != nullptr) {
            os << _HM_C(" else ");
            elseBlock->dump(os);
        }

    }